

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

void __thiscall rw::Geometry::allocateData(Geometry *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Triangle *pTVar4;
  TexCoords *pTVar5;
  MorphTarget *pMVar6;
  V3d **ppVVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  MorphTarget *pMVar11;
  long lVar12;
  bool bVar13;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 384"
  ;
  pTVar4 = (Triangle *)
           (*DAT_00145dd8)((long)((this->numVertices * 4 & (int)(this->flags << 0x1c) >> 0x1f) +
                                 (this->numVertices * this->numTexCoordSets + this->numTriangles) *
                                 8),0x3000f);
  this->triangles = pTVar4;
  uVar1 = this->numTriangles;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pTVar4[uVar9].matId = 0xffff;
  }
  pTVar5 = (TexCoords *)(pTVar4 + (int)uVar1);
  uVar1 = this->flags;
  iVar2 = this->numVertices;
  if ((uVar1 & 8) != 0) {
    this->colors = (RGBA *)pTVar5;
    pTVar5 = (TexCoords *)(&pTVar5->u + iVar2);
  }
  uVar10 = 0;
  uVar9 = (ulong)(uint)this->numTexCoordSets;
  if (this->numTexCoordSets < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    this->texCoords[uVar10] = pTVar5;
    pTVar5 = pTVar5 + iVar2;
  }
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 405"
  ;
  pMVar6 = (MorphTarget *)
           (*DAT_00145de0)(this->morphTargets,
                           (long)(iVar2 * 0xc + ((int)(uVar1 << 0x1b) >> 0x1f & iVar2 * 0xc) + 0x28)
                           * (long)this->numMorphTargets,0x3000f);
  this->morphTargets = pMVar6;
  iVar2 = this->numMorphTargets;
  iVar3 = this->numVertices;
  iVar8 = 0;
  if (0 < iVar2) {
    iVar8 = iVar2;
  }
  uVar1 = this->flags;
  ppVVar7 = &pMVar6->normals;
  lVar12 = (long)iVar3 * 0xc;
  pMVar6 = pMVar6 + iVar2;
  while (bVar13 = iVar8 != 0, iVar8 = iVar8 + -1, bVar13) {
    ((MorphTarget *)(ppVVar7 + -4))->parent = this;
    ppVVar7[-1] = (V3d *)0x0;
    *ppVVar7 = (V3d *)0x0;
    pMVar11 = pMVar6;
    if (iVar3 != 0) {
      pMVar11 = (MorphTarget *)((long)&pMVar6->parent + lVar12);
      ppVVar7[-1] = (V3d *)pMVar6;
      if ((uVar1 & 0x10) != 0) {
        *ppVVar7 = (V3d *)pMVar11;
        pMVar11 = (MorphTarget *)((long)&pMVar11->parent + lVar12);
      }
    }
    ppVVar7 = ppVVar7 + 5;
    pMVar6 = pMVar11;
  }
  return;
}

Assistant:

void
Geometry::allocateData(void)
{
	// Geometry data
	// Pretty much copy pasted from ::create above
	int32 sz = this->numTriangles*sizeof(Triangle);
	if(this->flags & PRELIT)
		sz += this->numVertices*sizeof(RGBA);
	sz += this->numTexCoordSets*this->numVertices*sizeof(TexCoords);

	uint8 *data = (uint8*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
	this->triangles = (Triangle*)data;
	data += this->numTriangles*sizeof(Triangle);
	for(int32 i = 0; i < this->numTriangles; i++)
		this->triangles[i].matId = 0xFFFF;
	if(this->flags & PRELIT){
		this->colors = (RGBA*)data;
		data += this->numVertices*sizeof(RGBA);
	}
	for(int32 i = 0; i < this->numTexCoordSets; i++){
		this->texCoords[i] = (TexCoords*)data;
		data += this->numVertices*sizeof(TexCoords);
	}

	// MorphTarget data
	// Bounding sphere is copied by realloc.
	sz = sizeof(MorphTarget) + this->numVertices*sizeof(V3d);
	if(this->flags & NORMALS)
		sz += this->numVertices*sizeof(V3d);

	MorphTarget *mt = (MorphTarget*)rwResize(this->morphTargets,
		sz*this->numMorphTargets, MEMDUR_EVENT | ID_GEOMETRY);
	this->morphTargets = mt;
	V3d *vdata = (V3d*)&mt[this->numMorphTargets];
	for(int32 i = 0; i < this->numMorphTargets; i++){
		mt->parent = this;
		mt->vertices = nil;
		mt->normals = nil;
		if(this->numVertices){
			mt->vertices = vdata;
			vdata += this->numVertices;
			if(this->flags & NORMALS){
				mt->normals = vdata;
				vdata += this->numVertices;
			}
		}
		mt++;
	}
}